

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall imrt::ApertureILS::simpleLocalSearch(ApertureILS *this,Plan *P,bool verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  double local_28;
  
  local_28 = Plan::getEvaluation(P);
  dVar2 = (double)(int)CONCAT71(in_register_00000011,verbose);
  do {
    (*(this->super_ILS)._vptr_ILS[3])(dVar2,this,P,1);
    dVar3 = extraout_XMM0_Qa;
    if (local_28 <= extraout_XMM0_Qa) {
      dVar3 = local_28;
    }
    (*(this->super_ILS)._vptr_ILS[4])(dVar2,this,P,1);
    local_28 = extraout_XMM0_Qa_00;
  } while (extraout_XMM0_Qa_00 < dVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Local search finished with: ",0x1c);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," effectively ",0xd);
  dVar2 = Plan::getEvaluation(P);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  dVar2 = Plan::getEvaluation(P);
  return dVar2;
}

Assistant:

double ApertureILS::simpleLocalSearch(Plan& P, bool verbose) {
  bool improvement=true;
  double local_best=P.getEvaluation(), aux_best;
  while (improvement) {
    improvement =false;
    aux_best = iLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
    }
    aux_best = aLocalSearch(P, verbose);
    if (aux_best<local_best) {
      local_best=aux_best;
      improvement=true;
    } 
  }
  cout << "Local search finished with: " << local_best << " effectively "<< P.getEvaluation()<< endl;
  return(P.getEvaluation());
}